

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathSetContextNode(xmlNodePtr node,xmlXPathContextPtr ctx)

{
  xmlXPathContextPtr ctx_local;
  xmlNodePtr node_local;
  
  if ((node == (xmlNodePtr)0x0) || (ctx == (xmlXPathContextPtr)0x0)) {
    node_local._4_4_ = -1;
  }
  else if (node->doc == ctx->doc) {
    ctx->node = node;
    node_local._4_4_ = 0;
  }
  else {
    node_local._4_4_ = -1;
  }
  return node_local._4_4_;
}

Assistant:

int
xmlXPathSetContextNode(xmlNodePtr node, xmlXPathContextPtr ctx) {
    if ((node == NULL) || (ctx == NULL))
        return(-1);

    if (node->doc == ctx->doc) {
        ctx->node = node;
	return(0);
    }
    return(-1);
}